

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

bool google::protobuf::internal::TcParser::ChangeOneof
               (TcParseTableBase *table,FieldEntry *entry,uint32_t field_num,ParseContext *ctx,
               MessageLite *msg)

{
  Cord *this;
  Arena *pAVar1;
  Cord **ppCVar2;
  LogMessage *pLVar3;
  LogMessageDebugFatal local_a8 [23];
  Voidify local_91;
  MessageLite **local_90;
  MessageLite **field_1;
  LogMessageDebugFatal local_78 [23];
  Voidify local_61;
  ArenaStringPtr *local_60;
  ArenaStringPtr *field;
  uint16_t current_rep;
  FieldEntry *pFStack_50;
  uint16_t current_kind;
  FieldEntry *current_entry;
  uint *puStack_40;
  uint32_t current_case;
  uint32_t *oneof_case;
  MessageLite *msg_local;
  ParseContext *ctx_local;
  FieldEntry *pFStack_20;
  uint32_t field_num_local;
  FieldEntry *entry_local;
  TcParseTableBase *table_local;
  
  oneof_case = (uint32_t *)msg;
  msg_local = (MessageLite *)ctx;
  ctx_local._4_4_ = field_num;
  pFStack_20 = entry;
  entry_local = (FieldEntry *)table;
  puStack_40 = RefAt<unsigned_int>(msg,(long)entry->has_idx);
  current_entry._4_4_ = *puStack_40;
  *puStack_40 = ctx_local._4_4_;
  if (current_entry._4_4_ == 0) {
    table_local._7_1_ = true;
  }
  else if (current_entry._4_4_ == ctx_local._4_4_) {
    table_local._7_1_ = false;
  }
  else {
    pFStack_50 = FindFieldEntry((TcParseTableBase *)entry_local,current_entry._4_4_);
    field._6_2_ = pFStack_50->type_card & 7;
    field._4_2_ = pFStack_50->type_card & 0x1c0;
    if (field._6_2_ == 5) {
      if (field._4_2_ == 0) {
        local_60 = RefAt<google::protobuf::internal::ArenaStringPtr>
                             (oneof_case,(ulong)pFStack_50->offset);
        ArenaStringPtr::Destroy(local_60);
      }
      else {
        if ((field._4_2_ == 0x40) || (field._4_2_ != 0x80)) {
          absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                    (local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x67b);
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_78);
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                             (pLVar3,(char (*) [25])"string rep not handled: ");
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                             (pLVar3,(uint)(field._4_2_ >> 6));
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar3);
          absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(local_78);
          return true;
        }
        pAVar1 = MessageLite::GetArena((MessageLite *)oneof_case);
        if (pAVar1 == (Arena *)0x0) {
          ppCVar2 = RefAt<absl::lts_20240722::Cord*>(oneof_case,(ulong)pFStack_50->offset);
          this = *ppCVar2;
          if (this != (Cord *)0x0) {
            absl::lts_20240722::Cord::~Cord(this);
            operator_delete(this,0x10);
          }
        }
      }
    }
    else if (field._6_2_ == 6) {
      if ((pFStack_50->type_card & 0x180) == 0) {
        local_90 = RefAt<google::protobuf::MessageLite*>(oneof_case,(ulong)pFStack_50->offset);
        pAVar1 = MessageLite::GetArena((MessageLite *)oneof_case);
        if ((pAVar1 == (Arena *)0x0) && (*local_90 != (MessageLite *)0x0)) {
          (*(*local_90)->_vptr_MessageLite[1])();
        }
      }
      else {
        absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  (local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x68a);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_a8);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [26])"message rep not handled: ");
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(uint)(field._4_2_ >> 6));
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar3);
        absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(local_a8);
      }
    }
    table_local._7_1_ = true;
  }
  return table_local._7_1_;
}

Assistant:

bool TcParser::ChangeOneof(const TcParseTableBase* table,
                           const TcParseTableBase::FieldEntry& entry,
                           uint32_t field_num, ParseContext* ctx,
                           MessageLite* msg) {
  // The _oneof_case_ value offset is stored in the has-bit index.
  uint32_t* oneof_case = &TcParser::RefAt<uint32_t>(msg, entry.has_idx);
  uint32_t current_case = *oneof_case;
  *oneof_case = field_num;

  if (current_case == 0) {
    // If the member is empty, we don't have anything to clear. Caller is
    // responsible for creating a new member object.
    return true;
  }
  if (current_case == field_num) {
    // If the member is already active, then it should be merged. We're done.
    return false;
  }
  // Look up the value that is already stored, and dispose of it if necessary.
  const FieldEntry* current_entry = FindFieldEntry(table, current_case);
  uint16_t current_kind = current_entry->type_card & field_layout::kFkMask;
  uint16_t current_rep = current_entry->type_card & field_layout::kRepMask;
  if (current_kind == field_layout::kFkString) {
    switch (current_rep) {
      case field_layout::kRepAString: {
        auto& field = RefAt<ArenaStringPtr>(msg, current_entry->offset);
        field.Destroy();
        break;
      }
      case field_layout::kRepCord: {
        if (msg->GetArena() == nullptr) {
          delete RefAt<absl::Cord*>(msg, current_entry->offset);
        }
        break;
      }
      case field_layout::kRepSString:
      case field_layout::kRepIString:
      default:
        ABSL_DLOG(FATAL) << "string rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        return true;
    }
  } else if (current_kind == field_layout::kFkMessage) {
    switch (current_rep) {
      case field_layout::kRepMessage:
      case field_layout::kRepGroup: {
        auto& field = RefAt<MessageLite*>(msg, current_entry->offset);
        if (!msg->GetArena()) {
          delete field;
        }
        break;
      }
      default:
        ABSL_DLOG(FATAL) << "message rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        break;
    }
  }
  return true;
}